

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall amrex::MLEBABecLap::normalize(MLEBABecLap *this,int amrlev,int mglev,MultiFab *mf)

{
  _func_int **pp_Var1;
  int iVar2;
  bool bVar3;
  Geometry *this_00;
  pointer pFVar4;
  MFIter *this_01;
  FabArray<amrex::EBCellFlagFab> *bx_00;
  MultiFab *pMVar5;
  anon_class_1136_23_0525a3f5 *f;
  long lVar6;
  long *in_RDI;
  Box tbx;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  bool beta_on_centroid;
  Array4<const_double> *bcfab;
  Array4<const_double> *bafab;
  Array4<const_double> *fczfab;
  Array4<const_double> *fcyfab;
  Array4<const_double> *fcxfab;
  Array4<const_double> *apzfab;
  Array4<const_double> *apyfab;
  Array4<const_double> *apxfab;
  Array4<const_double> *vfracfab;
  Array4<const_amrex::EBCellFlag> *flagfab;
  Array4<const_int> *ccmfab;
  Array4<const_double> *bebfab;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType fabtyp;
  Array4<const_double> *bzfab;
  Array4<const_double> *byfab;
  Array4<const_double> *bxfab;
  Array4<const_double> *afab;
  Array4<double> *fab;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  int ncomp;
  Real bscalar;
  Real ascalar;
  Array4<const_double> foo;
  bool is_eb_dirichlet;
  MultiCutFab *bcent;
  MultiCutFab *barea;
  Array<const_MultiCutFab_*,_3> fcent;
  Array<const_MultiCutFab_*,_3> area;
  MultiFab *vfrac;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  Real dhz;
  Real dhy;
  Real dhx;
  GpuArray<double,_3U> dxinvarray;
  iMultiFab *ccmask;
  MultiFab *bzcoef;
  MultiFab *bycoef;
  MultiFab *bxcoef;
  MultiFab *acoef;
  Real dhz_1;
  Real dhy_1;
  Real dhx_1;
  MFIter *in_stack_fffffffffffff038;
  MultiCutFab *in_stack_fffffffffffff040;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff048;
  MFItInfo *in_stack_fffffffffffff050;
  MFItInfo *in_stack_fffffffffffff060;
  undefined4 in_stack_fffffffffffff068;
  undefined4 in_stack_fffffffffffff06c;
  MFIter *in_stack_fffffffffffff070;
  FabType local_f84;
  MultiCutFab *local_f80;
  Box local_f44;
  iterator local_f28;
  iterator local_f10;
  undefined1 local_ef8 [40];
  undefined1 *local_ed0;
  byte local_ec1;
  undefined1 local_ec0 [32];
  Box *in_stack_fffffffffffff160;
  EBCellFlagFab *in_stack_fffffffffffff168;
  undefined1 local_e78 [64];
  undefined1 *local_e38;
  undefined1 local_e30 [64];
  undefined1 *local_df0;
  undefined1 local_de8 [64];
  undefined1 *local_da8;
  undefined1 local_da0 [64];
  undefined1 *local_d60;
  undefined1 local_d58 [64];
  undefined1 *local_d18;
  undefined1 local_d10 [64];
  undefined1 *local_cd0;
  undefined1 local_cc8 [64];
  undefined1 *local_c88;
  undefined1 local_c80 [64];
  undefined1 *local_c40;
  undefined1 local_c38 [64];
  undefined1 *local_bf8;
  undefined1 local_bf0 [64];
  undefined1 *local_bb0;
  undefined1 local_ba8 [64];
  undefined1 *local_b68;
  int local_b60;
  int local_b5c;
  int local_b58;
  int local_b54;
  undefined8 local_b50;
  int local_b48;
  undefined8 local_b3c;
  int local_b34;
  _func_int **local_b30;
  _Atomic_word local_b28;
  _func_int **local_b20;
  _Atomic_word local_b18;
  FabType local_b14;
  long local_b10 [8];
  long *local_ad0;
  long local_ac8 [8];
  long *local_a88;
  long local_a80 [8];
  long *local_a40;
  undefined1 local_a38 [136];
  MultiCutFab *local_9b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_9a4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_988;
  MFIter local_980;
  MFItInfo local_920;
  int local_90c;
  MultiArray4<const_amrex::EBCellFlag> local_908;
  pointer local_900;
  Array4<const_double> local_8f8;
  byte local_8b1;
  MultiCutFab *local_8b0;
  anon_class_1136_23_0525a3f5 *local_8a8;
  ShMem local_8a0;
  __uniq_ptr_impl<amrex::FBData<amrex::CutFab>,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
  local_888;
  undefined8 local_880;
  undefined8 local_878;
  MultiFab *local_870;
  FabArray<amrex::EBCellFlagFab> *local_868;
  MFIter *local_860;
  double local_858;
  double local_850;
  double local_848;
  GpuArray<double,_3U> local_840;
  iMultiFab *local_828;
  const_reference local_820;
  const_reference local_818;
  const_reference local_810;
  MultiFab *local_808;
  _func_int **local_7e8;
  _Atomic_word local_7e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7d8;
  int local_7cc;
  int iStack_7c8;
  _Atomic_word local_7c4;
  undefined8 local_7c0;
  int local_7b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7b0;
  int local_7a8;
  int iStack_7a4;
  int local_7a0;
  undefined4 local_79c;
  GpuArray<double,_3U> *local_798;
  undefined4 local_78c;
  GpuArray<double,_3U> *local_788;
  undefined4 local_77c;
  GpuArray<double,_3U> *local_778;
  undefined4 local_76c;
  GpuArray<double,_3U> *local_768;
  undefined4 local_75c;
  GpuArray<double,_3U> *local_758;
  undefined4 local_74c;
  GpuArray<double,_3U> *local_748;
  double local_740;
  double local_738;
  double local_730;
  Array4<const_amrex::EBCellFlag> *local_728;
  pointer local_720;
  GpuArray<double,_3U> *local_718;
  long *local_710;
  long *local_708;
  long *local_700;
  FabArray<amrex::EBCellFlagFab> *local_6f8;
  MultiCutFab *local_6f0;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  int local_6d8;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  MultiCutFab *local_6c8;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  long *local_6b0;
  int local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  long *local_698;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  long *local_680;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  long *local_668;
  int local_660;
  int local_65c;
  int local_658;
  int local_654;
  long *local_650;
  int local_648;
  int local_644;
  int local_640;
  int local_63c;
  long *local_638;
  undefined4 local_62c;
  GpuArray<double,_3U> *local_628;
  undefined4 local_61c;
  GpuArray<double,_3U> *local_618;
  undefined4 local_60c;
  GpuArray<double,_3U> *local_608;
  undefined4 local_5fc;
  GpuArray<double,_3U> *local_5f8;
  undefined4 local_5ec;
  GpuArray<double,_3U> *local_5e8;
  undefined4 local_5dc;
  GpuArray<double,_3U> *local_5d8;
  undefined1 local_5d0 [64];
  undefined1 auStack_590 [64];
  pointer local_550;
  undefined1 auStack_548 [64];
  double local_508;
  undefined1 auStack_500 [64];
  double local_4c0;
  undefined1 auStack_4b8 [64];
  double local_478;
  undefined1 auStack_470 [64];
  undefined1 auStack_430 [64];
  undefined1 auStack_3f0 [64];
  undefined1 auStack_3b0 [64];
  undefined1 auStack_370 [64];
  byte local_330;
  undefined1 auStack_328 [64];
  undefined1 auStack_2e8 [64];
  undefined1 auStack_2a8 [64];
  undefined1 auStack_268 [64];
  byte local_228;
  undefined1 auStack_220 [64];
  undefined1 auStack_1e0 [64];
  undefined1 auStack_1a0 [64];
  int local_160;
  byte local_15a;
  byte local_159;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  long *local_f8;
  long *local_f0;
  long *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  FabArray<amrex::EBCellFlagFab> *local_c8;
  pointer local_c0;
  MultiCutFab *local_b8;
  Box *local_b0;
  undefined4 local_a4;
  _Atomic_word *local_a0;
  undefined4 local_94;
  _Atomic_word *local_90;
  undefined4 local_84;
  _Atomic_word *local_80;
  undefined4 local_74;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined4 local_64;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined4 local_54;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  int local_44;
  int local_40;
  int local_3c;
  FabArray<amrex::EBCellFlagFab> *local_38;
  
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  local_808 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                        ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                         in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  local_810 = std::array<amrex::MultiFab,_3UL>::operator[]
                        ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff040,
                         (size_type)in_stack_fffffffffffff038);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  local_818 = std::array<amrex::MultiFab,_3UL>::operator[]
                        ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff040,
                         (size_type)in_stack_fffffffffffff038);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  local_820 = std::array<amrex::MultiFab,_3UL>::operator[]
                        ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff040,
                         (size_type)in_stack_fffffffffffff038);
  Vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  local_828 = Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>::operator[]
                        ((Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_> *)
                         in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                       in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  CoordSys::InvCellSizeArray(&local_840,&this_00->super_CoordSys);
  local_748 = &local_840;
  local_74c = 0;
  local_758 = &local_840;
  local_75c = 0;
  local_848 = (double)in_RDI[0x67] * local_840.arr[0] * local_840.arr[0];
  local_768 = &local_840;
  local_76c = 1;
  local_778 = &local_840;
  local_77c = 1;
  local_850 = (double)in_RDI[0x67] * local_840.arr[1] * local_840.arr[1];
  local_788 = &local_840;
  local_78c = 2;
  local_798 = &local_840;
  local_79c = 2;
  local_858 = (double)in_RDI[0x67] * local_840.arr[2] * local_840.arr[2];
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
  pFVar4 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)in_stack_fffffffffffff040);
  if (pFVar4 == (pointer)0x0) {
    this_01 = (MFIter *)0x0;
  }
  else {
    this_01 = (MFIter *)
              __dynamic_cast(pFVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
  }
  local_860 = this_01;
  if (this_01 == (MFIter *)0x0) {
    bx_00 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    bx_00 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                      ((EBFArrayBoxFactory *)in_stack_fffffffffffff040);
  }
  local_868 = bx_00;
  if (local_860 == (MFIter *)0x0) {
    pMVar5 = (MultiFab *)0x0;
  }
  else {
    pMVar5 = EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff040);
  }
  local_870 = pMVar5;
  if (local_860 == (MFIter *)0x0) {
    memset(&local_888,0,0x18);
    local_888._M_t.
    super__Tuple_impl<0UL,_amrex::FBData<amrex::CutFab>_*,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
    .super__Head_base<0UL,_amrex::FBData<amrex::CutFab>_*,_false>._M_head_impl =
         (tuple<amrex::FBData<amrex::CutFab>_*,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
         )(_Tuple_impl<0UL,_amrex::FBData<amrex::CutFab>_*,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
           )0x0;
    local_880 = 0;
    local_878 = 0;
  }
  else {
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff040);
  }
  if (local_860 == (MFIter *)0x0) {
    memset(&local_8a0,0,0x18);
    local_8a0.alloc = false;
    local_8a0._1_7_ = 0;
    local_8a0.n_values = 0;
    local_8a0.n_points = 0;
  }
  else {
    EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff040);
  }
  if (local_860 == (MFIter *)0x0) {
    f = (anon_class_1136_23_0525a3f5 *)0x0;
  }
  else {
    f = (anon_class_1136_23_0525a3f5 *)
        EBFArrayBoxFactory::getBndryArea((EBFArrayBoxFactory *)in_stack_fffffffffffff040);
  }
  local_8a8 = f;
  if (local_860 == (MFIter *)0x0) {
    local_f80 = (MultiCutFab *)0x0;
  }
  else {
    local_f80 = EBFArrayBoxFactory::getBndryCent((EBFArrayBoxFactory *)in_stack_fffffffffffff040);
  }
  local_8b0 = local_f80;
  local_8b1 = isEBDirichlet((MLEBABecLap *)0x14f6777);
  Array4<const_double>::Array4(&local_8f8);
  local_900 = (pointer)in_RDI[0x66];
  local_908.hp = (Array4<const_amrex::EBCellFlag> *)in_RDI[0x67];
  local_90c = (**(code **)(*in_RDI + 0x28))();
  MFItInfo::MFItInfo(in_stack_fffffffffffff050);
  MFItInfo::EnableTiling(&local_920,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFIter::MFIter(in_stack_fffffffffffff070,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                 in_stack_fffffffffffff060);
  while (bVar3 = MFIter::isValid(&local_980), bVar3) {
    MFIter::tilebox(this_01);
    local_988 = &local_9a4;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff048,
               (MFIter *)in_stack_fffffffffffff040);
    local_9b0 = (MultiCutFab *)(local_a38 + 0x48);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff048,
               (MFIter *)in_stack_fffffffffffff040);
    local_a38._64_8_ = local_a38;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff048,
               (MFIter *)in_stack_fffffffffffff040);
    local_a40 = local_a80;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff048,
               (MFIter *)in_stack_fffffffffffff040);
    local_a88 = local_ac8;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff048,
               (MFIter *)in_stack_fffffffffffff040);
    local_ad0 = local_b10;
    if (local_868 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      local_f84 = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[]
                ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff040,
                 in_stack_fffffffffffff038);
      local_f84 = EBCellFlagFab::getType(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
    }
    local_b14 = local_f84;
    if (local_f84 == regular) {
      local_7d8 = local_988;
      local_50 = local_988;
      local_54 = 0;
      local_7cc = *(int *)&local_988->_vptr__Sp_counted_base;
      local_60 = local_988;
      local_64 = 1;
      iStack_7c8 = *(int *)((long)&local_988->_vptr__Sp_counted_base + 4);
      local_b30 = local_988->_vptr__Sp_counted_base;
      local_70 = local_988;
      local_74 = 2;
      local_b28 = local_988->_M_use_count;
      local_7b0 = local_988;
      local_80 = &local_988->_M_weak_count;
      local_84 = 0;
      local_7a8 = *local_80;
      local_90 = &local_988->_M_weak_count;
      local_94 = 1;
      iStack_7a4 = *(int *)&local_988[1]._vptr__Sp_counted_base;
      local_b50 = *(undefined8 *)local_80;
      local_a0 = &local_988->_M_weak_count;
      local_a4 = 2;
      local_b48 = *(int *)((long)&local_988[1]._vptr__Sp_counted_base + 4);
      for (local_b54 = 0; iVar2 = local_b28, local_b3c = local_b50, local_b34 = local_b48,
          local_b20 = local_b30, local_b18 = local_b28, local_7e8 = local_b30, local_7e0 = local_b28
          , local_7c4 = local_b28, local_7c0 = local_b50, local_7b8 = local_b48,
          local_7a0 = local_b48, local_b54 < local_90c; local_b54 = local_b54 + 1) {
        while (local_b58 = iVar2, iVar2 = iStack_7c8, local_b58 <= local_b48) {
          while (local_b5c = iVar2, iVar2 = local_7cc, local_b5c <= iStack_7a4) {
            while (local_b60 = iVar2, local_b60 <= local_7a8) {
              local_6dc = local_b60;
              local_6e0 = local_b5c;
              local_6e4 = local_b58;
              local_6e8 = local_b54;
              local_6f0 = local_9b0;
              local_6f8 = (FabArray<amrex::EBCellFlagFab> *)local_a38._64_8_;
              local_700 = local_a40;
              local_708 = local_a88;
              local_710 = local_ad0;
              local_720 = local_900;
              local_728 = local_908.hp;
              local_718 = &local_840;
              local_5dc = 0;
              local_5ec = 0;
              local_730 = (double)local_908.hp * local_840.arr[0] * local_840.arr[0];
              local_5fc = 1;
              local_60c = 1;
              local_738 = (double)local_908.hp * local_840.arr[1] * local_840.arr[1];
              local_61c = 2;
              local_62c = 2;
              local_740 = (double)local_908.hp * local_840.arr[2] * local_840.arr[2];
              local_38 = (FabArray<amrex::EBCellFlagFab> *)local_a38._64_8_;
              local_3c = local_b60;
              local_40 = local_b5c;
              local_44 = local_b58;
              local_638 = local_a40;
              local_63c = local_b60;
              local_640 = local_b5c;
              local_644 = local_b58;
              local_648 = local_b54;
              local_650 = local_a40;
              local_654 = local_b60 + 1;
              local_658 = local_b5c;
              local_65c = local_b58;
              local_660 = local_b54;
              local_668 = local_a88;
              local_66c = local_b60;
              local_670 = local_b5c;
              local_674 = local_b58;
              local_678 = local_b54;
              local_680 = local_a88;
              local_684 = local_b60;
              local_688 = local_b5c + 1;
              local_68c = local_b58;
              local_690 = local_b54;
              local_698 = local_ad0;
              local_69c = local_b60;
              local_6a0 = local_b5c;
              local_6a4 = local_b58;
              local_6a8 = local_b54;
              local_6b0 = local_ad0;
              local_6b4 = local_b60;
              local_6b8 = local_b5c;
              local_6bc = local_b58 + 1;
              local_6c0 = local_b54;
              local_6c8 = local_9b0;
              local_6cc = local_b60;
              local_6d0 = local_b5c;
              local_6d4 = local_b58;
              local_6d8 = local_b54;
              pp_Var1 = (local_9b0->m_data).super_FabArrayBase._vptr_FabArrayBase;
              lVar6 = (long)(local_b60 -
                            *(int *)((long)&(local_9b0->m_data).super_FabArrayBase.boxarray.m_bat.
                                            m_op + 0x14)) +
                      (long)(local_b5c -
                            *(int *)((long)&(local_9b0->m_data).super_FabArrayBase.boxarray.m_bat.
                                            m_op + 0x18)) *
                      *(long *)&(local_9b0->m_data).super_FabArrayBase.boxarray.m_bat +
                      (long)(local_b58 -
                            *(int *)((long)&(local_9b0->m_data).super_FabArrayBase.boxarray.m_bat.
                                            m_op + 0x1c)) *
                      *(long *)((long)&(local_9b0->m_data).super_FabArrayBase.boxarray.m_bat.m_op +
                               4) +
                      (long)local_b54 *
                      *(long *)((long)&(local_9b0->m_data).super_FabArrayBase.boxarray.m_bat.m_op +
                               0xc);
              pp_Var1[lVar6] =
                   (_func_int *)
                   ((double)pp_Var1[lVar6] /
                   (local_740 *
                    (*(double *)
                      (*local_ad0 +
                      ((long)(local_b60 - (int)local_ad0[4]) +
                       (long)(local_b5c - *(int *)((long)local_ad0 + 0x24)) * local_ad0[1] +
                       (long)(local_b58 - (int)local_ad0[5]) * local_ad0[2] +
                      (long)local_b54 * local_ad0[3]) * 8) +
                    *(double *)
                     (*local_ad0 +
                     ((long)(local_b60 - (int)local_ad0[4]) +
                      (long)(local_b5c - *(int *)((long)local_ad0 + 0x24)) * local_ad0[1] +
                      (long)(local_6bc - (int)local_ad0[5]) * local_ad0[2] +
                     (long)local_b54 * local_ad0[3]) * 8)) +
                   local_738 *
                   (*(double *)
                     (*local_a88 +
                     ((long)(local_b60 - (int)local_a88[4]) +
                      (long)(local_b5c - *(int *)((long)local_a88 + 0x24)) * local_a88[1] +
                      (long)(local_b58 - (int)local_a88[5]) * local_a88[2] +
                     (long)local_b54 * local_a88[3]) * 8) +
                   *(double *)
                    (*local_a88 +
                    ((long)(local_b60 - (int)local_a88[4]) +
                     (long)(local_688 - *(int *)((long)local_a88 + 0x24)) * local_a88[1] +
                     (long)(local_b58 - (int)local_a88[5]) * local_a88[2] +
                    (long)local_b54 * local_a88[3]) * 8)) +
                   (double)local_900 *
                   *(double *)
                    (*(long *)local_a38._64_8_ +
                    ((long)(local_b60 - *(int *)(local_a38._64_8_ + 0x20)) +
                     (long)(local_b5c - *(int *)(local_a38._64_8_ + 0x24)) *
                     *(long *)&((BoxArray *)(local_a38._64_8_ + 8))->m_bat +
                    (long)(local_b58 - *(int *)(local_a38._64_8_ + 0x28)) *
                    *(long *)(local_a38._64_8_ + 0x10)) * 8) +
                   local_730 *
                   (*(double *)
                     (*local_a40 +
                     ((long)(local_b60 - (int)local_a40[4]) +
                      (long)(local_b5c - *(int *)((long)local_a40 + 0x24)) * local_a40[1] +
                      (long)(local_b58 - (int)local_a40[5]) * local_a40[2] +
                     (long)local_b54 * local_a40[3]) * 8) +
                   *(double *)
                    (*local_a40 +
                    ((long)(local_654 - (int)local_a40[4]) +
                     (long)(local_b5c - *(int *)((long)local_a40 + 0x24)) * local_a40[1] +
                     (long)(local_b58 - (int)local_a40[5]) * local_a40[2] +
                    (long)local_b54 * local_a40[3]) * 8))));
              local_628 = local_718;
              local_618 = local_718;
              local_608 = local_718;
              local_5f8 = local_718;
              local_5e8 = local_718;
              local_5d8 = local_718;
              iVar2 = local_b60 + 1;
            }
            iVar2 = local_b5c + 1;
          }
          iVar2 = local_b58 + 1;
        }
      }
    }
    else if (local_f84 == singlevalued) {
      if ((local_8b1 & 1) == 0) {
        memcpy(local_ba8,&local_8f8,0x3c);
      }
      else {
        Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                      *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
        Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      *)in_stack_fffffffffffff040,(size_type)in_stack_fffffffffffff038);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14f7414);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff048,
                   (MFIter *)in_stack_fffffffffffff040);
      }
      local_b68 = local_ba8;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffff048,
                 (MFIter *)in_stack_fffffffffffff040);
      local_bb0 = local_bf0;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (in_stack_fffffffffffff048,(MFIter *)in_stack_fffffffffffff040);
      local_bf8 = local_c38;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff048,
                 (MFIter *)in_stack_fffffffffffff040);
      local_c40 = local_c80;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff040,
                 (size_type)in_stack_fffffffffffff038);
      MultiCutFab::const_array(in_stack_fffffffffffff040,in_stack_fffffffffffff038);
      local_c88 = local_cc8;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff040,
                 (size_type)in_stack_fffffffffffff038);
      MultiCutFab::const_array(in_stack_fffffffffffff040,in_stack_fffffffffffff038);
      local_cd0 = local_d10;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff040,
                 (size_type)in_stack_fffffffffffff038);
      MultiCutFab::const_array(in_stack_fffffffffffff040,in_stack_fffffffffffff038);
      local_d18 = local_d58;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff040,
                 (size_type)in_stack_fffffffffffff038);
      MultiCutFab::const_array(in_stack_fffffffffffff040,in_stack_fffffffffffff038);
      local_d60 = local_da0;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff040,
                 (size_type)in_stack_fffffffffffff038);
      MultiCutFab::const_array(in_stack_fffffffffffff040,in_stack_fffffffffffff038);
      local_da8 = local_de8;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff040,
                 (size_type)in_stack_fffffffffffff038);
      MultiCutFab::const_array(in_stack_fffffffffffff040,in_stack_fffffffffffff038);
      local_df0 = local_e30;
      MultiCutFab::const_array(in_stack_fffffffffffff040,in_stack_fffffffffffff038);
      local_e38 = local_e78;
      MultiCutFab::const_array(in_stack_fffffffffffff040,in_stack_fffffffffffff038);
      local_ec1 = (int)in_RDI[0x65] == 1;
      Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff040);
      local_ed0 = local_ef8;
      Gpu::range_detail::range_impl<amrex::Box>::begin
                ((range_impl<amrex::Box> *)in_stack_fffffffffffff040);
      Gpu::range_detail::range_impl<amrex::Box>::end
                ((range_impl<amrex::Box> *)in_stack_fffffffffffff040);
      while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                               (&local_f10,&local_f28), bVar3) {
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_f44,&local_f10);
        local_b0 = &local_f44;
        local_b8 = local_9b0;
        local_c0 = local_900;
        local_c8 = (FabArray<amrex::EBCellFlagFab> *)local_a38._64_8_;
        local_d0 = local_848;
        local_d8 = local_850;
        local_e0 = local_858;
        local_e8 = local_a40;
        local_f0 = local_a88;
        local_f8 = local_ad0;
        local_100 = local_bb0;
        local_108 = local_bf8;
        local_110 = local_c40;
        local_118 = local_c88;
        local_120 = local_cd0;
        local_128 = local_d18;
        local_130 = local_d60;
        local_138 = local_da8;
        local_140 = local_df0;
        local_148 = local_e38;
        local_158 = local_b68;
        local_159 = local_8b1 & 1;
        local_15a = local_ec1 & 1;
        local_160 = local_90c;
        in_stack_fffffffffffff040 = local_9b0;
        in_stack_fffffffffffff048 = (FabArray<amrex::EBCellFlagFab> *)local_a38._64_8_;
        local_150 = local_ec0;
        memcpy(local_5d0,local_bf8,0x3c);
        memcpy(auStack_590,local_b8,0x3c);
        local_550 = local_c0;
        memcpy(auStack_548,local_c8,0x3c);
        local_508 = local_d0;
        memcpy(auStack_500,local_e8,0x3c);
        local_4c0 = local_d8;
        memcpy(auStack_4b8,local_f0,0x3c);
        local_478 = local_e0;
        memcpy(auStack_470,local_f8,0x3c);
        memcpy(auStack_430,local_110,0x3c);
        memcpy(auStack_3f0,local_118,0x3c);
        memcpy(auStack_3b0,local_120,0x3c);
        memcpy(auStack_370,local_128,0x3c);
        local_330 = local_15a & 1;
        memcpy(auStack_328,local_130,0x3c);
        memcpy(auStack_2e8,local_100,0x3c);
        memcpy(auStack_2a8,local_138,0x3c);
        memcpy(auStack_268,local_140,0x3c);
        local_228 = local_159 & 1;
        memcpy(auStack_220,local_150,0x3c);
        memcpy(auStack_1e0,local_148,0x3c);
        memcpy(auStack_1a0,local_158,0x3c);
        Loop<amrex::mlebabeclap_normalize(amrex::Box_const&,amrex::Array4<double>const&,double,amrex::Array4<double_const>const&,double,double,double,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,bool,bool,int)::_lambda(int,int,int,int)_1_>
                  ((Box *)bx_00,(int)((ulong)pMVar5 >> 0x20),f);
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_f10);
      }
    }
    MFIter::operator++(&local_980);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff040);
  return;
}

Assistant:

void
MLEBABecLap::normalize (int amrlev, int mglev, MultiFab& mf) const
{
    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    const auto dxinvarray = m_geom[amrlev][mglev].InvCellSizeArray();
    AMREX_D_TERM(Real dhx = m_b_scalar*dxinvarray[0]*dxinvarray[0];,
                 Real dhy = m_b_scalar*dxinvarray[1]*dxinvarray[1];,
                 Real dhz = m_b_scalar*dxinvarray[2]*dxinvarray[2];);

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* barea = (factory) ? &(factory->getBndryArea()) : nullptr;
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;

    bool is_eb_dirichlet =  isEBDirichlet();

    Array4<Real const> foo;

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;
    const int ncomp = getNComp();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& fab = mf.array(mfi);
        Array4<Real const> const& afab = acoef.const_array(mfi);
        AMREX_D_TERM(Array4<Real const> const& bxfab = bxcoef.const_array(mfi);,
                     Array4<Real const> const& byfab = bycoef.const_array(mfi);,
                     Array4<Real const> const& bzfab = bzcoef.const_array(mfi););

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        if (fabtyp == FabType::regular)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                mlabeclap_normalize(i,j,k,n, fab, afab, AMREX_D_DECL(bxfab, byfab, bzfab),
                                    dxinvarray, ascalar, bscalar);
            });
        }
        else if (fabtyp == FabType::singlevalued)
        {
            Array4<Real const> const& bebfab
                = (is_eb_dirichlet) ? m_eb_b_coeffs[amrlev][mglev]->const_array(mfi) : foo;
            Array4<int const> const& ccmfab = ccmask.const_array(mfi);
            Array4<EBCellFlag const> const& flagfab = flags->const_array(mfi);
            Array4<Real const> const& vfracfab = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                         Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                         Array4<Real const> const& apzfab = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcxfab = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcyfab = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fczfab = fcent[2]->const_array(mfi););
            Array4<Real const> const& bafab = barea->const_array(mfi);
            Array4<Real const> const& bcfab = bcent->const_array(mfi);

            bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mlebabeclap_normalize(tbx, fab, ascalar, afab,
                                      AMREX_D_DECL(dhx, dhy, dhz),
                                      AMREX_D_DECL(bxfab, byfab, bzfab),
                                      ccmfab, flagfab, vfracfab,
                                      AMREX_D_DECL(apxfab,apyfab,apzfab),
                                      AMREX_D_DECL(fcxfab,fcyfab,fczfab),
                                      bafab, bcfab, bebfab, is_eb_dirichlet,
                                      beta_on_centroid, ncomp);
            });
        }
    }
}